

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v5::internal::format_value<char,bidfx_public_api::price::subject::Subject>
               (basic_buffer<char> *buffer,Subject *value)

{
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  ios_base local_128 [264];
  
  formatbuf<char>::formatbuf(&format_buf,buffer);
  std::ostream::ostream((ostream *)&output,(streambuf *)&format_buf);
  std::ios::exceptions((int)(ostream *)&output + (int)*(undefined8 *)(_output + -0x18));
  bidfx_public_api::price::subject::operator<<(&output,value);
  basic_buffer<char>::resize(buffer,buffer->size_);
  std::ios_base::~ios_base(local_128);
  std::streambuf::~streambuf((streambuf *)&format_buf);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}